

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

void __thiscall
chrono::ChClassRegistration<chrono::ChShaftsThermalEngine>::~ChClassRegistration
          (ChClassRegistration<chrono::ChShaftsThermalEngine> *this)

{
  (this->super_ChClassRegistrationBase)._vptr_ChClassRegistrationBase =
       (_func_int **)&PTR_create_01170bc8;
  ChClassFactory::ClassUnregister(&this->m_sTagName);
  std::__cxx11::string::~string((string *)&this->m_sTagName);
  return;
}

Assistant:

virtual ~ChClassRegistration() {

        // register in global class factory
        ChClassFactory::ClassUnregister(this->m_sTagName);
    }